

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen_mask.cpp
# Opt level: O1

void __thiscall
cppurses::detail::Screen_mask::Screen_mask(Screen_mask *this,Widget *w,Constructor_tag tag)

{
  ulong in_RAX;
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  undefined8 uStack_38;
  
  sVar4 = (w->top_left_position_).x;
  uStack_38 = in_RAX;
  if (tag == Outer) {
    sVar1 = (w->top_left_position_).y;
  }
  else {
    sVar1 = Border_offset::west(w);
    sVar4 = sVar4 + sVar1;
    sVar2 = (w->top_left_position_).y;
    sVar1 = Border_offset::north(w);
    sVar1 = sVar1 + sVar2;
  }
  (this->offset_).x = sVar4;
  (this->offset_).y = sVar1;
  sVar4 = w->outer_width_;
  if (tag == Outer) {
    sVar1 = w->outer_height_;
  }
  else {
    sVar1 = Border_offset::east(w);
    sVar2 = Border_offset::west(w);
    sVar4 = sVar4 - (sVar2 + sVar1);
    sVar1 = w->outer_height_;
    sVar2 = Border_offset::north(w);
    sVar3 = Border_offset::south(w);
    sVar1 = sVar1 - (sVar3 + sVar2);
  }
  (this->area_).width = sVar4;
  (this->area_).height = sVar1;
  uStack_38 = uStack_38 & 0xffffffffffffff;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&this->bits_,sVar1 * sVar4,(bool *)((long)&uStack_38 + 7),
             (allocator_type *)((long)&uStack_38 + 6));
  return;
}

Assistant:

Screen_mask::Screen_mask(const Widget& w, Constructor_tag tag)
    : offset_{make_offset(w, tag)},
      area_{make_area(w, tag)},
      bits_(area_.width * area_.height) {}